

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRewrite.c
# Opt level: O0

Cut_Man_t * Abc_NtkStartCutManForRewrite(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Cut_Man_t *p;
  Vec_Int_t *vFanCounts;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Cut_Man_t *pManCut;
  Abc_Ntk_t *pNtk_local;
  
  memset(Abc_NtkStartCutManForRewrite::pParams,0,0x50);
  Abc_NtkStartCutManForRewrite::pParams->nVarsMax = 4;
  Abc_NtkStartCutManForRewrite::pParams->nKeepMax = 0xfa;
  Abc_NtkStartCutManForRewrite::pParams->fTruth = 1;
  Abc_NtkStartCutManForRewrite::pParams->fFilter = 1;
  Abc_NtkStartCutManForRewrite::pParams->fSeq = 0;
  Abc_NtkStartCutManForRewrite::pParams->fDrop = 0;
  Abc_NtkStartCutManForRewrite::pParams->fVerbose = 0;
  iVar1 = Abc_NtkObjNumMax(pNtk);
  Abc_NtkStartCutManForRewrite::pParams->nIdsMax = iVar1;
  p = Cut_ManStart(Abc_NtkStartCutManForRewrite::pParams);
  if (Abc_NtkStartCutManForRewrite::pParams->fDrop != 0) {
    vFanCounts = Abc_NtkFanoutCounts(pNtk);
    Cut_ManSetFanoutCounts(p,vFanCounts);
  }
  for (local_24 = 0; iVar1 = Abc_NtkCiNum(pNtk), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkCi(pNtk,local_24);
    iVar1 = Abc_ObjFanoutNum(pObj_00);
    if (0 < iVar1) {
      Cut_NodeSetTriv(p,pObj_00->Id);
    }
  }
  return p;
}

Assistant:

Cut_Man_t * Abc_NtkStartCutManForRewrite( Abc_Ntk_t * pNtk )
{
    static Cut_Params_t Params, * pParams = &Params;
    Cut_Man_t * pManCut;
    Abc_Obj_t * pObj;
    int i;
    // start the cut manager
    memset( pParams, 0, sizeof(Cut_Params_t) );
    pParams->nVarsMax  = 4;     // the max cut size ("k" of the k-feasible cuts)
    pParams->nKeepMax  = 250;   // the max number of cuts kept at a node
    pParams->fTruth    = 1;     // compute truth tables
    pParams->fFilter   = 1;     // filter dominated cuts
    pParams->fSeq      = 0;     // compute sequential cuts
    pParams->fDrop     = 0;     // drop cuts on the fly
    pParams->fVerbose  = 0;     // the verbosiness flag
    pParams->nIdsMax   = Abc_NtkObjNumMax( pNtk );
    pManCut = Cut_ManStart( pParams );
    if ( pParams->fDrop )
        Cut_ManSetFanoutCounts( pManCut, Abc_NtkFanoutCounts(pNtk) );
    // set cuts for PIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        if ( Abc_ObjFanoutNum(pObj) > 0 )
            Cut_NodeSetTriv( pManCut, pObj->Id );
    return pManCut;
}